

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O0

size_t __thiscall PosixLockedPageAllocator::GetLimit(PosixLockedPageAllocator *this)

{
  int iVar1;
  long in_FS_OFFSET;
  rlimit rlim;
  unsigned_long local_20;
  rlimit local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = getrlimit(__RLIMIT_MEMLOCK,&local_18);
  if ((iVar1 == 0) && (local_18.rlim_cur != 0xffffffffffffffff)) {
    local_20 = local_18.rlim_cur;
  }
  else {
    local_20 = std::numeric_limits<unsigned_long>::max();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_20;
}

Assistant:

size_t PosixLockedPageAllocator::GetLimit()
{
#ifdef RLIMIT_MEMLOCK
    struct rlimit rlim;
    if (getrlimit(RLIMIT_MEMLOCK, &rlim) == 0) {
        if (rlim.rlim_cur != RLIM_INFINITY) {
            return rlim.rlim_cur;
        }
    }
#endif
    return std::numeric_limits<size_t>::max();
}